

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O0

FT_Error cff_decoder_prepare(CFF_Decoder *decoder,CFF_Size size,FT_UInt glyph_index)

{
  void *pvVar1;
  byte bVar2;
  FT_Int FVar3;
  CFF_Internal internal;
  FT_Size ftsize;
  FT_Byte fd_index;
  FT_Service_CFFLoad cffload;
  CFF_SubFont pCStack_38;
  FT_Error error;
  CFF_SubFont sub;
  CFF_Font_conflict cff;
  CFF_Builder *builder;
  FT_UInt glyph_index_local;
  CFF_Size size_local;
  CFF_Decoder *decoder_local;
  
  pvVar1 = (((decoder->builder).face)->extra).data;
  pCStack_38 = (CFF_SubFont)((long)pvVar1 + 0x668);
  if (*(int *)((long)pvVar1 + 0xb30) != 0) {
    bVar2 = (**(code **)(*(long *)((long)pvVar1 + 0x1368) + 0x10))
                      ((long)pvVar1 + 0x1338,glyph_index);
    if (*(uint *)((long)pvVar1 + 0xb30) <= (uint)bVar2) {
      return 3;
    }
    pCStack_38 = *(CFF_SubFont *)((long)pvVar1 + (ulong)bVar2 * 8 + 0xb38);
    if (((decoder->builder).hints_funcs != (void *)0x0) && (size != (CFF_Size)0x0)) {
      (decoder->builder).hints_globals =
           *(void **)((long)((size->root).internal)->module_data + (ulong)bVar2 * 8 + 8);
    }
  }
  decoder->num_locals = (pCStack_38->local_subrs_index).count;
  decoder->locals = pCStack_38->local_subrs;
  FVar3 = cff_compute_bias((decoder->cff->top_font).font_dict.charstring_type,decoder->num_locals);
  decoder->locals_bias = FVar3;
  decoder->glyph_width = (pCStack_38->private_dict).default_width;
  decoder->nominal_width = (pCStack_38->private_dict).nominal_width;
  decoder->current_subfont = pCStack_38;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_decoder_prepare( CFF_Decoder*  decoder,
                       CFF_Size      size,
                       FT_UInt       glyph_index )
  {
    CFF_Builder  *builder = &decoder->builder;
    CFF_Font      cff     = (CFF_Font)builder->face->extra.data;
    CFF_SubFont   sub     = &cff->top_font;
    FT_Error      error   = FT_Err_Ok;

    FT_Service_CFFLoad  cffload = (FT_Service_CFFLoad)cff->cffload;


    /* manage CID fonts */
    if ( cff->num_subfonts )
    {
      FT_Byte  fd_index = cffload->fd_select_get( &cff->fd_select,
                                                  glyph_index );


      if ( fd_index >= cff->num_subfonts )
      {
        FT_TRACE4(( "cff_decoder_prepare: invalid CID subfont index\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      FT_TRACE3(( "  in subfont %d:\n", fd_index ));

      sub = cff->subfonts[fd_index];

      if ( builder->hints_funcs && size )
      {
        FT_Size       ftsize   = FT_SIZE( size );
        CFF_Internal  internal = (CFF_Internal)ftsize->internal->module_data;


        /* for CFFs without subfonts, this value has already been set */
        builder->hints_globals = (void *)internal->subfonts[fd_index];
      }
    }

    decoder->num_locals  = sub->local_subrs_index.count;
    decoder->locals      = sub->local_subrs;
    decoder->locals_bias = cff_compute_bias(
                             decoder->cff->top_font.font_dict.charstring_type,
                             decoder->num_locals );

    decoder->glyph_width   = sub->private_dict.default_width;
    decoder->nominal_width = sub->private_dict.nominal_width;

    decoder->current_subfont = sub;

  Exit:
    return error;
  }